

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::findOrCreateShape(SemanticParser *this,SP *pbrtShape)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  pointer psVar3;
  pointer psVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  char cVar8;
  mapped_type *pmVar9;
  element_type *peVar10;
  key_type *in_RDX;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  bool bVar14;
  SP SVar15;
  SP SVar16;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  peVar11 = pbrtShape[0x12].super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var13 = &pbrtShape[0x11].super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  peVar10 = (element_type *)p_Var13;
  if (peVar11 != (element_type *)0x0) {
    do {
      bVar14 = *(element_type **)
                ((long)&(peVar11->super_Node).super_ParamSet.param._M_t._M_impl + 0x18) <
               (in_RDX->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (!bVar14) {
        peVar10 = peVar11;
      }
      peVar11 = *(element_type **)
                 (&(((_Rb_tree_header *)
                    ((long)&(peVar11->super_Node).super_ParamSet.param._M_t._M_impl + 8))->_M_header
                   )._M_color + (ulong)bVar14 * 2);
    } while (peVar11 != (element_type *)0x0);
  }
  peVar11 = (element_type *)p_Var13;
  if ((peVar10 != (element_type *)p_Var13) &&
     (peVar11 = peVar10,
     (in_RDX->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr <
     *(element_type **)((long)&(peVar10->super_Node).super_ParamSet.param._M_t._M_impl + 0x18))) {
    peVar11 = (element_type *)p_Var13;
  }
  if (peVar11 == (element_type *)p_Var13) {
    p_Var1 = (in_RDX->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    emitShape(this,pbrtShape);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    pmVar9 = std::
             map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
             ::operator[]((map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
                           *)(pbrtShape + 0x11),in_RDX);
    (pmVar9->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)
         (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var13 = &(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar9->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               p_Var13);
    peVar2 = (((in_RDX->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->attributes).
             super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var12._M_pi = extraout_RDX_00;
    if (peVar2 != (element_type *)0x0) {
      *(bool *)((long)&(((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->cameras).
                       super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                       ._M_impl.super__Vector_impl_data + 0x10) = peVar2->reverseOrientation;
      psVar3 = (peVar2->areaLightSources).
               super__Vector_base<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = *(pointer *)
                ((long)&(peVar2->areaLightSources).
                        super__Vector_base<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
                        ._M_impl + 8);
      if (psVar3 != psVar4) {
        if (0x10 < (ulong)((long)psVar4 - (long)psVar3)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: Shape has more than one area light!?",0x2d);
          cVar8 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
          p_Var13 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ulong)(uint)(int)cVar8;
          std::ostream::put(-0x70);
          std::ostream::flush();
        }
        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  (*(long *)&(peVar2->areaLightSources).
                             super__Vector_base<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
                             ._M_impl.super__Vector_impl_data + 8);
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          }
        }
        SVar15 = parseAreaLight((SemanticParser *)&stack0xffffffffffffffd8,(SP *)p_Var13);
        _Var7._M_pi = _Stack_20._M_pi;
        peVar6 = local_28;
        _Var12 = SVar15.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        peVar5 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_28 = (element_type *)0x0;
        _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (peVar5->pixelFilter).
                  super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (peVar5->pixelFilter).super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)peVar6;
        (peVar5->pixelFilter).super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var7._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          _Var12._M_pi = extraout_RDX_01;
        }
        if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
          _Var12._M_pi = extraout_RDX_02;
        }
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          _Var12._M_pi = extraout_RDX_03;
        }
      }
    }
  }
  else {
    pmVar9 = std::
             map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
             ::operator[]((map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
                           *)(pbrtShape + 0x11),in_RDX);
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pmVar9->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var1 = (pmVar9->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var1;
    _Var12._M_pi = extraout_RDX;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
  }
  SVar16.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  SVar16.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar16.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::findOrCreateShape(pbrt::syntactic::Shape::SP pbrtShape)
  {
    if (emittedShapes.find(pbrtShape) != emittedShapes.end())
      return emittedShapes[pbrtShape];

    Shape::SP newShape = emitShape(pbrtShape);
    emittedShapes[pbrtShape] = newShape;

    if (pbrtShape->attributes) {
      newShape->reverseOrientation
        = pbrtShape->attributes->reverseOrientation;
      /* now, add area light sources */
      
      if (!pbrtShape->attributes->areaLightSources.empty()) {
        // std::cout << "Shape has " << pbrtShape->attributes->areaLightSources.size()
        //           << " area light sources..." << std::endl;
        auto &areaLights = pbrtShape->attributes->areaLightSources;
        if (areaLights.size() > 1)
          std::cout << "Warning: Shape has more than one area light!?" << std::endl;
        newShape->areaLight = parseAreaLight(areaLights[0]);
      }
    }

    return newShape;
  }